

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

void __thiscall nite::Color::set(Color *this,string *hex)

{
  long lVar1;
  char *local_48 [2];
  char local_38 [16];
  char *local_28;
  char *p;
  
  std::__cxx11::string::substr((ulong)local_48,(ulong)hex);
  lVar1 = strtol(local_48[0],&local_28,0x10);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  this->r = (float)((uint)((ulong)lVar1 >> 0x10) & 0xff) / 255.0;
  this->g = (float)((uint)((ulong)lVar1 >> 8) & 0xff) / 255.0;
  this->b = (float)((uint)lVar1 & 0xff) / 255.0;
  this->a = 1.0;
  return;
}

Assistant:

void nite::Color::set(const String &hex){
	char *p;
	int hexValue = strtol(hex.substr(1).c_str(), &p, 16);
  r = ((hexValue >> 16) & 0xFF) / 255.0;  // Extract the RR byte
  g = ((hexValue >> 8) & 0xFF) / 255.0;   // Extract the GG byte
  b = ((hexValue) & 0xFF) / 255.0;        // Extract the BB byte
  a = 1.0f;
}